

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_Subspan_Test::TestBody(GslSpan_Subspan_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference peVar3;
  AssertHelper local_630;
  Message local_628;
  int local_61c;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_22;
  undefined1 auStack_600 [4];
  int i_1;
  span<int,__1L> av2_1;
  Message local_5e8;
  int local_5dc;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_5d8;
  index_type local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_21;
  Message local_5a8;
  int local_59c;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_598;
  index_type local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_20;
  Message local_568;
  int local_55c;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_558;
  index_type local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_19;
  Message local_528;
  int local_51c;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_518;
  index_type local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_18;
  span<int,_5L> av_7;
  Message local_4e0;
  int local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_17;
  undefined1 auStack_4b8 [4];
  int i;
  span<int,__1L> av2;
  Message local_4a0;
  int local_494;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_490;
  index_type local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_16;
  Message local_460;
  int local_454;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_450;
  index_type local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_15;
  Message local_420;
  int local_414;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_410;
  index_type local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_14;
  Message local_3e0;
  int local_3d4;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_3d0;
  index_type local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_3a0 [8];
  span<int,__1L> av_6;
  Message local_388;
  int local_37c;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_378;
  index_type local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_12;
  span<int,__1L> av_5;
  Message local_338;
  int local_32c;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_328;
  index_type local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_11;
  Message local_2f8;
  int local_2ec;
  storage_type<pstore::gsl::details::extent_type<0L>_> local_2e8;
  index_type local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_10;
  span<int,__1L> av_4;
  Message local_2b0;
  int local_2a4;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_2a0;
  index_type local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_9;
  Message local_270;
  int local_264;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_260;
  index_type local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_8;
  Message local_230;
  int local_224;
  storage_type<pstore::gsl::details::extent_type<0L>_> local_220;
  index_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_7;
  span<int,_5L> av_3;
  Message local_1f0;
  int local_1e4;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_1e0;
  index_type local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_6;
  Message local_1b0;
  int local_1a4;
  storage_type<pstore::gsl::details::extent_type<5L>_> local_1a0;
  index_type local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_5;
  span<int,_5L> av_2;
  Message local_170;
  int local_164;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_160;
  index_type local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  Message local_130;
  int local_124;
  storage_type<pstore::gsl::details::extent_type<0L>_> local_120;
  index_type local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  span<int,_5L> av_1;
  Message local_f0;
  int local_e4;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_e0;
  index_type local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  int local_a4;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_a0;
  index_type local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  int local_54;
  storage_type<pstore::gsl::details::extent_type<2L>_> local_50;
  index_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  span<int,_5L> av;
  int arr [5];
  GslSpan_Subspan_Test *this_local;
  
  av.storage_.data_ = (storage_type<pstore::gsl::details::extent_type<5L>_>)(pointer)0x200000001;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  local_50.data_ =
       (pointer)pstore::gsl::span<int,5l>::subspan<2l,2l>((span<int,5l> *)&gtest_ar.message_);
  local_48 = pstore::gsl::span<int,_2L>::length((span<int,_2L> *)&local_50);
  local_54 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_40,"(av.subspan<2, 2> ().length ())","2",&local_48,&local_54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_a0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar.message_,2,2);
  local_90 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_a0);
  local_a4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_88,"av.subspan (2, 2).length ()","2",&local_90,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_e0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar.message_,2,3);
  local_d0 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_e0);
  local_e4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_c8,"av.subspan (2, 3).length ()","3",&local_d0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_1,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_1);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  local_120.data_ =
       (pointer)pstore::gsl::span<int,5l>::subspan<0l,0l>((span<int,5l> *)&gtest_ar_3.message_);
  local_118 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&local_120);
  local_124 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_110,"(av.subspan<0, 0> ().length ())","0",&local_118,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x330,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_160 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_3.message_,0,0);
  local_150 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_160);
  local_164 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_148,"av.subspan (0, 0).length ()","0",&local_150,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x331,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_2,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_2);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  local_1a0.data_ =
       (pointer)pstore::gsl::span<int,5l>::subspan<0l,5l>((span<int,5l> *)&gtest_ar_5.message_);
  local_198 = pstore::gsl::span<int,_5L>::length((span<int,_5L> *)&local_1a0);
  local_1a4 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_190,"(av.subspan<0, 5> ().length ())","5",&local_198,&local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x335,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1e0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_5.message_,0,5);
  local_1d0 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_1e0);
  local_1e4 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1c8,"(av.subspan (0, 5).length ())","5",&local_1d0,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x336,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_3,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_3);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  local_220.data_ =
       (pointer)pstore::gsl::span<int,5l>::subspan<4l,0l>((span<int,5l> *)&gtest_ar_7.message_);
  local_218 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&local_220);
  local_224 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_210,"(av.subspan<4, 0> ().length ())","0",&local_218,&local_224);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_260 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_7.message_,4,0);
  local_250 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_260);
  local_264 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_248,"av.subspan (4, 0).length ()","0",&local_250,&local_264);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_2a0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_7.message_,5,0);
  local_290 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_2a0);
  local_2a4 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_288,"av.subspan (5, 0).length ()","0",&local_290,&local_2a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_4.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_4.storage_.data_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_4.storage_.data_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)&gtest_ar_10.message_);
  local_2e8.data_ =
       (pointer)pstore::gsl::span<int,-1l>::subspan<0l,0l>((span<int,_1l> *)&gtest_ar_10.message_);
  local_2e0 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&local_2e8);
  local_2ec = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2d8,"(av.subspan<0, 0> ().length ())","0",&local_2e0,&local_2ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x340,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_328 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)&gtest_ar_10.message_,0,0);
  local_318 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_328);
  local_32c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_310,"av.subspan (0, 0).length ()","0",&local_318,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_5.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x341,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_5.storage_.data_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_5.storage_.data_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)&gtest_ar_12.message_);
  local_378 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)&gtest_ar_12.message_,0,-1);
  local_368 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_378);
  local_37c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_360,"av.subspan (0).length ()","0",&local_368,&local_37c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av_6.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x345,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av_6.storage_.data_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_6.storage_.data_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  pstore::gsl::span<int,-1l>::span<int,5l>
            ((span<int,_1l> *)local_3a0,(span<int,_5L> *)&gtest_ar_13.message_);
  local_3d0 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_3a0,0,-1);
  local_3c0 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_3d0);
  local_3d4 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3b8,"av.subspan (0).length ()","5",&local_3c0,&local_3d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x349,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_410 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_3a0,1,-1);
  local_400 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_410);
  local_414 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3f8,"av.subspan (1).length ()","4",&local_400,&local_414);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_450 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_3a0,4,-1);
  local_440 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_450);
  local_454 = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_438,"av.subspan (4).length ()","1",&local_440,&local_454);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_490 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_3a0,5,-1);
  local_480 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_490);
  local_494 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_478,"av.subspan (5).length ()","0",&local_480,&local_494);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av2.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av2.storage_.data_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av2.storage_.data_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  _auStack_4b8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_3a0,1,-1);
  for (gtest_ar_17.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_17.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 4;
      gtest_ar_17.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_17.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    peVar3 = pstore::gsl::span<int,_-1L>::operator[]
                       ((span<int,__1L> *)auStack_4b8,
                        (long)gtest_ar_17.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
    local_4d4 = gtest_ar_17.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ + 2;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_4d0,"av2[i]","i + 2",peVar3,&local_4d4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
    if (!bVar1) {
      testing::Message::Message(&local_4e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&av_7,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x34f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&av_7,&local_4e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av_7);
      testing::Message::~Message(&local_4e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  }
  gtest_ar_18.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&av);
  local_518 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_18.message_,0,-1);
  local_508 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_518);
  local_51c = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_500,"av.subspan (0).length ()","5",&local_508,&local_51c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x354,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_558 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_18.message_,1,-1);
  local_548 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_558);
  local_55c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_540,"av.subspan (1).length ()","4",&local_548,&local_55c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x355,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_598 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_18.message_,4,-1);
  local_588 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_598);
  local_59c = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_580,"av.subspan (4).length ()","1",&local_588,&local_59c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x356,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5d8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_18.message_,5,-1);
  local_5c8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&local_5d8);
  local_5dc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_5c0,"av.subspan (5).length ()","0",&local_5c8,&local_5dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&av2_1.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x357,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&av2_1.storage_.data_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&av2_1.storage_.data_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  _auStack_600 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)&gtest_ar_18.message_,1,-1);
  for (gtest_ar_22.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_22.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 4;
      gtest_ar_22.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_22.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    peVar3 = pstore::gsl::span<int,_-1L>::operator[]
                       ((span<int,__1L> *)auStack_600,
                        (long)gtest_ar_22.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
    local_61c = gtest_ar_22.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ + 2;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_618,"av2[i]","i + 2",peVar3,&local_61c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
    if (!bVar1) {
      testing::Message::Message(&local_628);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
      testing::internal::AssertHelper::AssertHelper
                (&local_630,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x35a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_630,&local_628);
      testing::internal::AssertHelper::~AssertHelper(&local_630);
      testing::Message::~Message(&local_628);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  }
  return;
}

Assistant:

TEST (GslSpan, Subspan) {
    int arr[5] = {1, 2, 3, 4, 5};

    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<2, 2> ().length ()), 2);
        EXPECT_EQ (av.subspan (2, 2).length (), 2);
        EXPECT_EQ (av.subspan (2, 3).length (), 3);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<0, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (0, 0).length (), 0);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<0, 5> ().length ()), 5);
        EXPECT_EQ ((av.subspan (0, 5).length ()), 5);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<4, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (4, 0).length (), 0);
        EXPECT_EQ (av.subspan (5, 0).length (), 0);
    }
    {
        span<int> av;
        EXPECT_EQ ((av.subspan<0, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (0, 0).length (), 0);
    }
    {
        span<int> av;
        EXPECT_EQ (av.subspan (0).length (), 0);
    }
    {
        span<int> av = make_span (arr);
        EXPECT_EQ (av.subspan (0).length (), 5);
        EXPECT_EQ (av.subspan (1).length (), 4);
        EXPECT_EQ (av.subspan (4).length (), 1);
        EXPECT_EQ (av.subspan (5).length (), 0);
        auto av2 = av.subspan (1);
        for (int i = 0; i < 4; ++i) {
            EXPECT_EQ (av2[i], i + 2);
        }
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ (av.subspan (0).length (), 5);
        EXPECT_EQ (av.subspan (1).length (), 4);
        EXPECT_EQ (av.subspan (4).length (), 1);
        EXPECT_EQ (av.subspan (5).length (), 0);
        auto av2 = av.subspan (1);
        for (int i = 0; i < 4; ++i) {
            EXPECT_EQ (av2[i], i + 2);
        }
    }
}